

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.h
# Opt level: O3

BOOLEAN __thiscall BVStatic<2048UL>::TestAndClear(BVStatic<2048UL> *this,BVIndex i)

{
  ulong uVar1;
  byte bVar2;
  
  AssertRange(this,i);
  AssertRange(this,i);
  BVUnitT<unsigned_long>::AssertRange(i & 0x3f);
  uVar1 = this->data[i >> 6].word;
  BVUnitT<unsigned_long>::AssertRange(i & 0x3f);
  bVar2 = (byte)i & 0x3f;
  this->data[i >> 6].word =
       this->data[i >> 6].word & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
  return (uVar1 >> ((ulong)i & 0x3f) & 1) != 0;
}

Assistant:

BOOLEAN TestAndClear(BVIndex i)
    {
        AssertRange(i);
        BVUnit * bvUnit = this->BitsFromIndex(i);
        BVIndex offset = BVUnit::Offset(i);
        BOOLEAN bit = bvUnit->Test(offset);
        bvUnit->Clear(offset);
        return bit;
    }